

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void AddByte(Lexer *lexer,tmbchar ch)

{
  uint uVar1;
  uint uVar2;
  tmbstr ptVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = lexer->lexlength;
  uVar2 = lexer->lexsize;
  uVar4 = uVar1;
  if (uVar2 + 2 < uVar1) {
LAB_00145e4b:
    uVar1 = lexer->lexsize;
    lexer->lexsize = uVar1 + 1;
    lexer->lexbuf[uVar1] = ch;
    lexer->lexbuf[lexer->lexsize] = '\0';
    return;
  }
  do {
    do {
      if (uVar2 + 2 < uVar4) {
        ptVar3 = (tmbstr)(*lexer->allocator->vtbl->realloc)
                                   (lexer->allocator,lexer->lexbuf,(size_t)uVar4);
        if (ptVar3 != (tmbstr)0x0) {
          memset(ptVar3 + lexer->lexlength,0,(ulong)(uVar4 - lexer->lexlength));
          lexer->lexbuf = ptVar3;
          lexer->lexlength = uVar4;
        }
        goto LAB_00145e4b;
      }
      bVar5 = uVar4 == 0;
      uVar4 = uVar4 * 2;
      if (bVar5) {
        uVar4 = 0x2000;
      }
    } while (uVar1 <= uVar4);
    (*lexer->allocator->vtbl->panic)
              (lexer->allocator,"\nPanic: out of internal memory!\nDocument input too big!\n");
    uVar2 = lexer->lexsize;
  } while( true );
}

Assistant:

static void AddByte( Lexer *lexer, tmbchar ch )
{
    if ( lexer->lexsize + 2 >= lexer->lexlength )
    {
        tmbstr buf = NULL;
        uint allocAmt = lexer->lexlength;
        uint prev = allocAmt; /* Is. #761 */
        while ( lexer->lexsize + 2 >= allocAmt )
        {
            if ( allocAmt == 0 )
                allocAmt = 8192;
            else
                allocAmt *= 2;
            if (allocAmt < prev) /* Is. #761 - watch for wrap - and */
                TidyPanic(lexer->allocator, "\nPanic: out of internal memory!\nDocument input too big!\n");
        }
        buf = (tmbstr) TidyRealloc( lexer->allocator, lexer->lexbuf, allocAmt );
        if ( buf )
        {
          TidyClearMemory( buf + lexer->lexlength, 
                           allocAmt - lexer->lexlength );
          lexer->lexbuf = buf;
          lexer->lexlength = allocAmt;
        }
    }

    lexer->lexbuf[ lexer->lexsize++ ] = ch;
    lexer->lexbuf[ lexer->lexsize ]   = '\0';  /* debug */
}